

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O1

bool __thiscall
GlobOpt::TypeSpecializeIntUnary
          (GlobOpt *this,Instr **pInstr,Value **pSrc1Val,Value **pDstVal,int32 min,int32 max,
          Value *src1OriginalVal,bool *redoTypeSpecRef,bool skipDst)

{
  OpCode OVar1;
  Opnd *pOVar2;
  Instr *pIVar3;
  code *pcVar4;
  BailOutKind bailOutKind;
  bool bVar5;
  bool bVar6;
  OpndKind OVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  undefined4 *puVar13;
  RegOpnd *pRVar14;
  IntConstOpnd *pIVar15;
  AddSubConstantInfo *addSubConstantInfo_00;
  JITTimeFunctionBody *pJVar16;
  FunctionJITTimeInfo *pFVar17;
  char16 *pcVar18;
  Value *pVVar19;
  ulong uVar20;
  char *pDstVal_00;
  byte bVar21;
  uint uVar22;
  uint uVar23;
  OpCode OVar24;
  uint uVar25;
  byte bVar26;
  Value *local_a0;
  Value *src2Val;
  AddSubConstantInfo addSubConstantInfo;
  undefined1 local_78 [8];
  anon_class_16_2_639d4b01 CannotOverflowBasedOnRelativeBounds;
  
  if (pSrc1Val == (Value **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar13 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x1f87,"(pSrc1Val)","pSrc1Val");
    if (!bVar6) goto LAB_0046591f;
    *puVar13 = 0;
  }
  bVar26 = this->field_0xf4;
  addSubConstantInfo._16_8_ = pDstVal;
  OVar7 = IR::Opnd::GetKind((*pInstr)->m_src1);
  if (OVar7 == OpndKindReg) {
    pOVar2 = (*pInstr)->m_src1;
    OVar7 = IR::Opnd::GetKind(pOVar2);
    if (OVar7 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar13 = 1;
      bVar6 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar6) goto LAB_0046591f;
      *puVar13 = 0;
    }
    if (((ulong)pOVar2[1]._vptr_Opnd[3] & 2) != 0) {
      return false;
    }
  }
  bVar26 = bVar26 >> 2 & 1;
  src2Val = (Value *)0x0;
  pIVar3 = *pInstr;
  OVar1 = pIVar3->m_opcode;
  pDstVal_00 = (char *)(ulong)OVar1;
  OVar24 = Ld_I4;
  bVar6 = true;
  uVar10 = min;
  uVar23 = max;
  if (LdMethodElem < OVar1) {
    CannotOverflowBasedOnRelativeBounds.this = (GlobOpt *)src1OriginalVal;
    if (OVar1 < ArgOut_A_Inline) {
      uVar22 = OVar1 - 0x9a;
      if (uVar22 < 0x38) {
        if ((0xa0003000000000U >> ((ulong)uVar22 & 0x3f) & 1) != 0) {
          return false;
        }
        if ((5UL >> ((ulong)uVar22 & 0x3f) & 1) != 0) {
LAB_00464c48:
          pOVar2 = pIVar3->m_dst;
          OVar7 = IR::Opnd::GetKind(pOVar2);
          if (OVar7 == OpndKindIndir) {
LAB_00464cae:
            local_78._0_2_ = *(undefined2 *)(pOVar2[1]._vptr_Opnd + 1);
            bVar6 = ValueType::IsLikelyAnyArrayWithNativeFloatValues((ValueType *)local_78);
            if (bVar6) {
              *pSrc1Val = src1OriginalVal;
              pDstVal_00 = (char *)src1OriginalVal;
            }
            bVar6 = TypeSpecializeStElem(this,pInstr,*pSrc1Val,(Value **)pDstVal_00);
            return bVar6;
          }
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          pDstVal_00 = "Bad call to AsIndirOpnd()";
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0x1c8,"(this->IsIndirOpnd())","Bad call to AsIndirOpnd()");
          if (bVar6) {
            *puVar13 = 0;
            goto LAB_00464cae;
          }
          goto LAB_0046591f;
        }
      }
      if (OVar1 == MultiBr) {
        bailOutKind = BailOutInvalid;
        bVar9 = false;
        OVar24 = MultiBr;
        goto LAB_00465336;
      }
      if (OVar1 == LdC_A_I4) {
        pIVar15 = (IntConstOpnd *)pIVar3->m_src1;
        OVar7 = IR::Opnd::GetKind((Opnd *)pIVar15);
        if (OVar7 != OpndKindIntConst) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar9 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                             ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
          if (!bVar9) goto LAB_0046591f;
          *puVar13 = 0;
        }
        uVar10 = IR::IntConstOpnd::AsInt32(pIVar15);
        bVar5 = false;
        uVar23 = uVar10;
LAB_004650cf:
        bailOutKind = BailOutInvalid;
        bVar9 = false;
        bVar21 = 0;
        OVar24 = Ld_I4;
        goto LAB_00465338;
      }
    }
    else {
      pDstVal_00 = (char *)(ulong)(OVar1 - 0x1ed);
      if (OVar1 - 0x1ed < 0x40) {
        if ((0xc79UL >> ((ulong)pDstVal_00 & 0x3f) & 1) != 0) {
          return false;
        }
        if ((Value *)pDstVal_00 == (Value *)0x3f) goto LAB_00464c48;
      }
    }
    goto switchD_00464d02_caseD_25;
  }
  uVar20 = (ulong)(OVar1 - 0x43);
  if (OVar1 - 0x43 < 0x3c) {
    if ((0x8a8a00000400000U >> (uVar20 & 0x3f) & 1) != 0) {
      return false;
    }
    if (uVar20 == 0) {
      CannotOverflowBasedOnRelativeBounds.this = (GlobOpt *)src1OriginalVal;
      bailOutKind = BailOutInvalid;
      bVar21 = 0;
      bVar9 = false;
      bVar5 = true;
    }
    else {
      if (uVar20 != 2) goto LAB_00464ce8;
      CannotOverflowBasedOnRelativeBounds.this = (GlobOpt *)src1OriginalVal;
      OVar7 = IR::Opnd::GetKind(pIVar3->m_src1);
      if (OVar7 != OpndKindReg) {
        bVar5 = true;
        goto LAB_004650cf;
      }
      pRVar14 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
      bVar8 = GlobOptBlockData::IsInt32TypeSpecialized
                        (&this->currentBlock->globOptData,&pRVar14->m_sym->super_Sym);
      bailOutKind = BailOutInvalid;
      bVar21 = 0;
      bVar9 = false;
      bVar5 = true;
      OVar24 = Ld_I4;
      if (!bVar8) {
        return false;
      }
    }
    goto LAB_00465338;
  }
LAB_00464ce8:
  CannotOverflowBasedOnRelativeBounds.this = (GlobOpt *)src1OriginalVal;
  switch(OVar1) {
  case Ret:
    goto switchD_00464d02_caseD_24;
  case Yield:
switchD_00464d02_caseD_25:
    CannotOverflowBasedOnRelativeBounds.this = (GlobOpt *)src1OriginalVal;
    bVar6 = OpCodeAttr::IsInlineBuiltIn(OVar1);
    if (!bVar6) {
      return false;
    }
    OVar24 = (*pInstr)->m_opcode;
    break;
  case Incr_A:
    local_78 = (undefined1  [8])pSrc1Val;
    CannotOverflowBasedOnRelativeBounds.src1Val = (Value **)this;
    uVar10 = min + 1U;
    if (SCARRY4(min,1)) {
      bVar6 = TypeSpecializeIntUnary::anon_class_16_2_639d4b01::operator()
                        ((anon_class_16_2_639d4b01 *)local_78);
      uVar10 = 0x7fffffff;
      if (bVar6) goto LAB_00465089;
      bVar6 = IR::Instr::ShouldCheckForIntOverflow(*pInstr);
      uVar10 = 0x80000000;
      if (bVar6) {
        uVar10 = min + 1U;
      }
      uVar22 = (uint)!bVar6 * 4 + 1;
      bVar21 = 1;
      if (bVar6) {
        bVar21 = bVar26;
      }
LAB_00465294:
      bVar26 = bVar21;
      bailOutKind = BailOutInvalid;
      uVar23 = 0x7fffffff;
    }
    else {
LAB_00465089:
      bailOutKind = BailOutInvalid;
      if (SCARRY4(max,1)) {
        bVar6 = TypeSpecializeIntUnary::anon_class_16_2_639d4b01::operator()
                          ((anon_class_16_2_639d4b01 *)local_78);
        uVar23 = 0x7fffffff;
        if (bVar6) {
          uVar22 = 0;
        }
        else {
          bVar6 = IR::Instr::ShouldCheckForIntOverflow(*pInstr);
          if (!bVar6) {
            uVar22 = 5;
            uVar10 = 0x80000000;
            bVar21 = 1;
            goto LAB_00465294;
          }
          uVar22 = *(uint *)&this->field_0xf4 & 0x200;
          uVar23 = 0x7fffffff;
          if (uVar22 == 0) {
            uVar23 = max + 1U;
          }
          bailOutKind = uVar22 * 2;
          uVar22 = uVar22 >> 9 ^ 1;
        }
      }
      else {
        uVar22 = 0;
        uVar23 = max + 1U;
      }
    }
    if ((uVar22 != 5) && (uVar22 != 0)) {
      return false;
    }
    if ((bVar26 == 0) && (OVar7 = IR::Opnd::GetKind((*pInstr)->m_src1), OVar7 == OpndKindReg)) {
      pRVar14 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
      AddSubConstantInfo::Set((AddSubConstantInfo *)&src2Val,pRVar14->m_sym,*pSrc1Val,min == max,1);
    }
    OVar24 = Add_I4;
    if (this->prePassLoop == (Loop *)0x0) {
      pIVar3 = *pInstr;
      pIVar15 = IR::IntConstOpnd::New(1,TyInt32,pIVar3->m_func,false);
      IR::Instr::SetSrc2(pIVar3,&pIVar15->super_Opnd);
      OVar24 = Add_I4;
    }
    goto LAB_00465331;
  case Decr_A:
    local_78 = (undefined1  [8])pSrc1Val;
    CannotOverflowBasedOnRelativeBounds.src1Val = (Value **)this;
    uVar23 = max - 1U;
    if (SBORROW4(max,1)) {
      bVar6 = TypeSpecializeIntUnary::anon_class_16_2_639d4b01::operator()
                        ((anon_class_16_2_639d4b01 *)local_78);
      uVar23 = 0x80000000;
      if (bVar6) goto LAB_00465054;
      bVar6 = IR::Instr::ShouldCheckForIntOverflow(*pInstr);
      uVar23 = 0x7fffffff;
      if (bVar6) {
        uVar23 = max - 1U;
      }
      uVar22 = 7;
      if (bVar6) {
        uVar22 = 1;
      }
      else {
        bVar26 = 1;
      }
LAB_004651e5:
      bailOutKind = BailOutInvalid;
      uVar10 = 0x80000000;
    }
    else {
LAB_00465054:
      bailOutKind = BailOutInvalid;
      if (SBORROW4(min,1)) {
        bVar6 = TypeSpecializeIntUnary::anon_class_16_2_639d4b01::operator()
                          ((anon_class_16_2_639d4b01 *)local_78);
        uVar10 = 0x80000000;
        if (bVar6) {
          uVar22 = 0;
        }
        else {
          bVar6 = IR::Instr::ShouldCheckForIntOverflow(*pInstr);
          if (!bVar6) {
            bVar26 = 1;
            uVar22 = 7;
            uVar23 = 0x7fffffff;
            goto LAB_004651e5;
          }
          uVar22 = *(uint *)&this->field_0xf4 & 0x200;
          uVar10 = 0x80000000;
          if (uVar22 == 0) {
            uVar10 = min - 1U;
          }
          bailOutKind = uVar22 * 2;
          uVar22 = uVar22 >> 9 ^ 1;
        }
      }
      else {
        uVar22 = 0;
        uVar10 = min - 1U;
      }
    }
    if ((uVar22 != 7) && (uVar22 != 0)) {
      return false;
    }
    if ((bVar26 == 0) && (OVar7 = IR::Opnd::GetKind((*pInstr)->m_src1), OVar7 == OpndKindReg)) {
      pRVar14 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
      AddSubConstantInfo::Set((AddSubConstantInfo *)&src2Val,pRVar14->m_sym,*pSrc1Val,min == max,-1)
      ;
    }
    OVar24 = Sub_I4;
    if (this->prePassLoop == (Loop *)0x0) {
      pIVar3 = *pInstr;
      pIVar15 = IR::IntConstOpnd::New(1,TyInt32,pIVar3->m_func,false);
      IR::Instr::SetSrc2(pIVar3,&pIVar15->super_Opnd);
      OVar24 = Sub_I4;
    }
LAB_00465331:
    bVar6 = false;
    goto LAB_00465334;
  case Neg_A:
    bailOutKind = BailOutInvalid;
    if (max < 0 || 0 < min) {
      bVar21 = 0;
    }
    else {
      bVar6 = IR::Instr::ShouldCheckForNegativeZero(pIVar3);
      bVar21 = 1;
      if (bVar6) {
        bVar21 = 0;
        if (max == 0 && min == 0) {
          return false;
        }
        bailOutKind = BailOutOnNegativeZero;
        if ((*(uint *)&this->field_0xf4 & 0x200) == 0) {
          return false;
        }
      }
    }
    uVar22 = -min;
    uVar25 = -max;
    bVar6 = IR::Instr::ShouldCheckForIntOverflow(*pInstr);
    uVar10 = 0x80000000;
    if ((int)uVar25 <= (int)uVar22 || bVar6) {
      uVar10 = uVar25;
    }
    uVar23 = 0x7fffffff;
    if ((int)uVar25 <= (int)uVar22 || bVar6) {
      uVar23 = uVar22;
    }
    OVar24 = Neg_I4;
    bVar6 = false;
    bVar9 = false;
    bVar5 = false;
    goto LAB_00465338;
  case Not_A:
    bailOutKind = BailOutInvalid;
    if ((this->field_0xf5 & 0x10) == 0) {
      return false;
    }
    uVar22 = ~min;
    uVar23 = ~max;
    uVar10 = uVar23;
    if ((int)uVar22 < (int)uVar23) {
      uVar10 = uVar22;
    }
    if ((int)uVar23 < (int)uVar22) {
      uVar23 = uVar22;
    }
    OVar24 = Not_I4;
    bVar6 = true;
    bVar9 = true;
    goto LAB_00465336;
  default:
    if (1 < OVar1 - 0xe) goto switchD_00464d02_caseD_25;
    bVar6 = DoConstFold(this);
    if (((bVar6) && (this->prePassLoop == (Loop *)0x0)) &&
       (bVar6 = TryOptConstFoldBrFalse(this,*pInstr,*pSrc1Val,min,max), bVar6)) {
      return true;
    }
    bVar6 = ValueInfo::HasIntConstantValue((*pSrc1Val)->valueInfo,false);
    bVar9 = true;
    if ((!bVar6) && (OVar7 = IR::Opnd::GetKind((*pInstr)->m_src1), OVar7 == OpndKindReg)) {
      pRVar14 = IR::Opnd::AsRegOpnd((*pInstr)->m_src1);
      bVar9 = GlobOptBlockData::IsInt32TypeSpecialized
                        (&this->currentBlock->globOptData,&pRVar14->m_sym->super_Sym);
    }
    if ((*pInstr)->m_opcode == BrTrue_A) {
      UpdateIntBoundsForNotEqualBranch(this,*pSrc1Val,(Value *)0x0,0);
      OVar24 = BrTrue_I4;
    }
    else {
      UpdateIntBoundsForEqualBranch(this,*pSrc1Val,(Value *)0x0,0);
      OVar24 = BrFalse_I4;
    }
    if (bVar9 == false) {
      return false;
    }
    uVar10 = 2;
    uVar23 = 1;
  }
  bailOutKind = BailOutInvalid;
  bVar6 = true;
LAB_00465334:
  bVar9 = false;
LAB_00465336:
  bVar21 = 0;
  bVar5 = false;
LAB_00465338:
  if ((((bVar6) || (bVar21 != 0)) || (bVar26 != 0)) ||
     ((bVar6 = IR::Instr::ShouldCheckForIntOverflow(*pInstr), !bVar6 ||
      (bVar6 = IsWorthSpecializingToInt32(this,*pInstr,*pSrc1Val,(Value *)0x0), bVar6)))) {
    *(uint *)&this->field_0xf4 =
         (uint)bVar26 * 4 + (uint)bVar21 * 8 | *(uint *)&this->field_0xf4 & 0xfffffff3;
    local_78 = (undefined1  [8])0x0;
    local_a0 = (Value *)0x0;
    bVar6 = CSEOptimize(this,this->currentBlock,pInstr,pSrc1Val,&local_a0,(Value **)local_78,true);
    if (!bVar6) {
      pIVar3 = *pInstr;
      OVar1 = pIVar3->m_opcode;
      if (this->prePassLoop == (Loop *)0x0) {
        pIVar3->m_opcode = OVar24;
      }
      if (bVar9 == false) {
        CannotOverflowBasedOnRelativeBounds.this = (GlobOpt *)*pSrc1Val;
      }
      ToTypeSpecUse(this,pIVar3,pIVar3->m_src1,this->currentBlock,
                    (Value *)CannotOverflowBasedOnRelativeBounds.this,(IndirOpnd *)0x0,TyInt32,
                    BailOutIntOnly,bVar9,(Instr *)0x0);
      if ((bailOutKind != BailOutInvalid) && (this->prePassLoop == (Loop *)0x0)) {
        GenerateBailAtOperation(this,pInstr,bailOutKind);
      }
      if ((!skipDst) && ((*pInstr)->m_dst != (Opnd *)0x0)) {
        if (((bool)(this->prePassLoop == (Loop *)0x0 & bVar5)) &&
           ((uVar10 != min || (uVar23 != max)))) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar13 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar13 = 1;
          bVar6 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                             ,0x214a,
                             "(!(isTransfer && !this->IsLoopPrePass()) || min == newMin && max == newMax)"
                             ,"If this is just a copy, old/new min/max should be the same");
          if (!bVar6) {
LAB_0046591f:
            pcVar4 = (code *)invalidInstructionException();
            (*pcVar4)();
          }
          *puVar13 = 0;
        }
        if (bVar5) {
          pVVar19 = *pSrc1Val;
        }
        else {
          pVVar19 = (Value *)0x0;
        }
        addSubConstantInfo_00 = (AddSubConstantInfo *)&src2Val;
        if (src2Val == (Value *)0x0) {
          addSubConstantInfo_00 = (AddSubConstantInfo *)0x0;
        }
        TypeSpecializeIntDst
                  (this,*pInstr,OVar1,pVVar19,*pSrc1Val,(Value *)0x0,bailOutKind,uVar10,uVar23,
                   (Value **)addSubConstantInfo._16_8_,addSubConstantInfo_00);
      }
      pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
      uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar16);
      pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
      uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar17);
      bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,uVar11,uVar12);
      if (bailOutKind == BailOutInvalid) {
        if (bVar6) {
          Output::Print(L"TRACE ");
          if (this->prePassLoop != (Loop *)0x0) {
            Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                          (ulong)(this->prePassLoop->loopNumber - 1));
          }
          Output::Print(L": ");
          Output::Print(L"Type specialized to INT\n");
          Output::Flush();
        }
        bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,AggressiveIntTypeSpecPhase);
        if (!bVar6) {
          return true;
        }
        Output::Print(L"Type specialized to INT: ");
      }
      else {
        if (bVar6) {
          Output::Print(L"TRACE ");
          if (this->prePassLoop != (Loop *)0x0) {
            Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                          (ulong)(this->prePassLoop->loopNumber - 1));
          }
          Output::Print(L": ");
          Output::Print(L"Type specialized to INT with bailout on:\n");
          Output::Flush();
        }
        if ((bailOutKind >> 10 & 1) != 0) {
          pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
          uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar16);
          pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
          uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar17);
          bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,uVar11,uVar12);
          if (bVar6) {
            Output::Print(L"TRACE ");
            if (this->prePassLoop != (Loop *)0x0) {
              Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                            (ulong)(this->prePassLoop->loopNumber - 1));
            }
            Output::Print(L": ");
            Output::Print(L"    Overflow\n");
            Output::Flush();
          }
          bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,AggressiveIntTypeSpecPhase);
          if (bVar6) {
            Output::Print(L"Type specialized to INT with bailout (%S): ","Overflow");
            pcVar18 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
            Output::Print(L"%s \n",pcVar18);
          }
        }
        if (bailOutKind >> 0xc == 0) {
          return true;
        }
        pJVar16 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
        uVar11 = JITTimeFunctionBody::GetSourceContextId(pJVar16);
        pFVar17 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
        uVar12 = FunctionJITTimeInfo::GetLocalFunctionId(pFVar17);
        bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015cd718,GlobOptPhase,uVar11,uVar12);
        if (bVar6) {
          Output::Print(L"TRACE ");
          if (this->prePassLoop != (Loop *)0x0) {
            Output::Print(L"[%d, %d]",(ulong)(this->rootLoopPrePass->loopNumber - 1),
                          (ulong)(this->prePassLoop->loopNumber - 1));
          }
          Output::Print(L": ");
          Output::Print(L"    Zero\n");
          Output::Flush();
        }
        bVar6 = Js::Phases::IsEnabled((Phases *)&DAT_015d3490,AggressiveIntTypeSpecPhase);
        if (!bVar6) {
          return true;
        }
        Output::Print(L"Type specialized to INT with bailout (%S): ","Zero");
      }
      pcVar18 = Js::OpCodeUtil::GetOpCodeName((*pInstr)->m_opcode);
      Output::Print(L"%s \n",pcVar18);
      return true;
    }
    *redoTypeSpecRef = true;
  }
  else {
    if (((bailOutKind == BailOutInvalid) && ((*pInstr)->m_dst != (Opnd *)0x0)) &&
       (((this->field_0xf5 & 2) != 0 || (this->prePassLoop == (Loop *)0x0)))) {
      pVVar19 = CreateDstUntransferredIntValue(this,uVar10,uVar23,*pInstr,*pSrc1Val,(Value *)0x0);
      *(Value **)addSubConstantInfo._16_8_ = pVVar19;
    }
    if ((*pInstr)->m_src2 != (Opnd *)0x0) {
      IR::Instr::FreeSrc2(*pInstr);
    }
  }
switchD_00464d02_caseD_24:
  return false;
}

Assistant:

bool
GlobOpt::TypeSpecializeIntUnary(
    IR::Instr **pInstr,
    Value **pSrc1Val,
    Value **pDstVal,
    int32 min,
    int32 max,
    Value *const src1OriginalVal,
    bool *redoTypeSpecRef,
    bool skipDst /* = false */)
{
    IR::Instr *&instr = *pInstr;

    Assert(pSrc1Val);
    Value *&src1Val = *pSrc1Val;

    bool isTransfer = false;
    Js::OpCode opcode;
    int32 newMin, newMax;
    bool lossy = false;
    IR::BailOutKind bailOutKind = IR::BailOutInvalid;
    bool ignoredIntOverflow = this->ignoredIntOverflowForCurrentInstr;
    bool ignoredNegativeZero = false;
    bool checkTypeSpecWorth = false;

    if(instr->GetSrc1()->IsRegOpnd() && instr->GetSrc1()->AsRegOpnd()->m_sym->m_isNotNumber)
    {
        return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
    }

    AddSubConstantInfo addSubConstantInfo;

    switch(instr->m_opcode)
    {
    case Js::OpCode::Ld_A:
        if (instr->GetSrc1()->IsRegOpnd())
        {
            StackSym *sym = instr->GetSrc1()->AsRegOpnd()->m_sym;
            if (CurrentBlockData()->IsInt32TypeSpecialized(sym) == false)
            {
                // Type specializing an Ld_A isn't worth it, unless the src
                // is already type specialized.
                return false;
            }
        }
        newMin = min;
        newMax = max;
        opcode = Js::OpCode::Ld_I4;
        isTransfer = true;
        break;

    case Js::OpCode::Conv_Num:
        newMin = min;
        newMax = max;
        opcode = Js::OpCode::Ld_I4;
        isTransfer = true;
        break;

    case Js::OpCode::LdC_A_I4:
        newMin = newMax = instr->GetSrc1()->AsIntConstOpnd()->AsInt32();
        opcode = Js::OpCode::Ld_I4;
        break;

    case Js::OpCode::Neg_A:
        if (min <= 0 && max >= 0)
        {
            if(instr->ShouldCheckForNegativeZero())
            {
                // -0 matters since the sym is not a local, or is used in a way in which -0 would differ from +0
                if(!DoAggressiveIntTypeSpec())
                {
                    // May result in -0
                    // Consider adding a dynamic check for src1 == 0
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                if(min == 0 && max == 0)
                {
                    // Always results in -0
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                bailOutKind |= IR::BailOutOnNegativeZero;
            }
            else
            {
                ignoredNegativeZero = true;
            }
        }
        if (Int32Math::Neg(min, &newMax))
        {
            if(instr->ShouldCheckForIntOverflow())
            {
                if(!DoAggressiveIntTypeSpec())
                {
                    // May overflow
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                if(min == max)
                {
                    // Always overflows
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                bailOutKind |= IR::BailOutOnOverflow;
                newMax = INT32_MAX;
            }
            else
            {
                ignoredIntOverflow = true;
            }
        }
        if (Int32Math::Neg(max, &newMin))
        {
            if(instr->ShouldCheckForIntOverflow())
            {
                if(!DoAggressiveIntTypeSpec())
                {
                    // May overflow
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                bailOutKind |= IR::BailOutOnOverflow;
                newMin = INT32_MAX;
            }
            else
            {
                ignoredIntOverflow = true;
            }
        }
        if(!instr->ShouldCheckForIntOverflow() && newMin > newMax)
        {
            // When ignoring overflow, the range needs to account for overflow. Since MIN_INT is the only int32 value that
            // overflows on Neg, and the value resulting from overflow is also MIN_INT, if calculating only the new min or new
            // max overflowed but not both, then the new min will be greater than the new max. In that case we need to consider
            // the full range of int32s as possible resulting values.
            newMin = INT32_MIN;
            newMax = INT32_MAX;
        }
        opcode = Js::OpCode::Neg_I4;
        checkTypeSpecWorth = true;
        break;

    case Js::OpCode::Not_A:
        if(!DoLossyIntTypeSpec())
        {
            return false;
        }
        this->PropagateIntRangeForNot(min, max, &newMin, &newMax);
        opcode = Js::OpCode::Not_I4;
        lossy = true;
        break;

    case Js::OpCode::Incr_A:
        do // while(false)
        {
            const auto CannotOverflowBasedOnRelativeBounds = [&]()
            {
                const ValueInfo *const src1ValueInfo = src1Val->GetValueInfo();
                return
                    (src1ValueInfo->IsInt() || DoAggressiveIntTypeSpec()) &&
                    src1ValueInfo->IsIntBounded() &&
                    src1ValueInfo->AsIntBounded()->Bounds()->AddCannotOverflowBasedOnRelativeBounds(1);
            };

            if (Int32Math::Inc(min, &newMin))
            {
                if(CannotOverflowBasedOnRelativeBounds())
                {
                    newMin = INT32_MAX;
                }
                else if(instr->ShouldCheckForIntOverflow())
                {
                    // Always overflows
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                else
                {
                    // When ignoring overflow, the range needs to account for overflow. For any Add or Sub, since overflow
                    // causes the value to wrap around, and we don't have a way to specify a lower and upper range of ints,
                    // we use the full range of int32s.
                    ignoredIntOverflow = true;
                    newMin = INT32_MIN;
                    newMax = INT32_MAX;
                    break;
                }
            }
            if (Int32Math::Inc(max, &newMax))
            {
                if(CannotOverflowBasedOnRelativeBounds())
                {
                    newMax = INT32_MAX;
                }
                else if(instr->ShouldCheckForIntOverflow())
                {
                    if(!DoAggressiveIntTypeSpec())
                    {
                        // May overflow
                        return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                    }
                    bailOutKind |= IR::BailOutOnOverflow;
                    newMax = INT32_MAX;
                }
                else
                {
                    // See comment about ignoring overflow above
                    ignoredIntOverflow = true;
                    newMin = INT32_MIN;
                    newMax = INT32_MAX;
                    break;
                }
            }
        } while(false);

        if(!ignoredIntOverflow && instr->GetSrc1()->IsRegOpnd())
        {
            addSubConstantInfo.Set(instr->GetSrc1()->AsRegOpnd()->m_sym, src1Val, min == max, 1);
        }

        opcode = Js::OpCode::Add_I4;
        if (!this->IsLoopPrePass())
        {
            instr->SetSrc2(IR::IntConstOpnd::New(1, TyInt32, instr->m_func));
        }
        checkTypeSpecWorth = true;
        break;

    case Js::OpCode::Decr_A:
        do // while(false)
        {
            const auto CannotOverflowBasedOnRelativeBounds = [&]()
            {
                const ValueInfo *const src1ValueInfo = src1Val->GetValueInfo();
                return
                    (src1ValueInfo->IsInt() || DoAggressiveIntTypeSpec()) &&
                    src1ValueInfo->IsIntBounded() &&
                    src1ValueInfo->AsIntBounded()->Bounds()->SubCannotOverflowBasedOnRelativeBounds(1);
            };

            if (Int32Math::Dec(max, &newMax))
            {
                if(CannotOverflowBasedOnRelativeBounds())
                {
                    newMax = INT32_MIN;
                }
                else if(instr->ShouldCheckForIntOverflow())
                {
                    // Always overflows
                    return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                }
                else
                {
                    // When ignoring overflow, the range needs to account for overflow. For any Add or Sub, since overflow
                    // causes the value to wrap around, and we don't have a way to specify a lower and upper range of ints, we
                    // use the full range of int32s.
                    ignoredIntOverflow = true;
                    newMin = INT32_MIN;
                    newMax = INT32_MAX;
                    break;
                }
            }
            if (Int32Math::Dec(min, &newMin))
            {
                if(CannotOverflowBasedOnRelativeBounds())
                {
                    newMin = INT32_MIN;
                }
                else if(instr->ShouldCheckForIntOverflow())
                {
                    if(!DoAggressiveIntTypeSpec())
                    {
                        // May overflow
                        return TryTypeSpecializeUnaryToFloatHelper(pInstr, &src1Val, src1OriginalVal, pDstVal);
                    }
                    bailOutKind |= IR::BailOutOnOverflow;
                    newMin = INT32_MIN;
                }
                else
                {
                    // See comment about ignoring overflow above
                    ignoredIntOverflow = true;
                    newMin = INT32_MIN;
                    newMax = INT32_MAX;
                    break;
                }
            }
        } while(false);

        if(!ignoredIntOverflow && instr->GetSrc1()->IsRegOpnd())
        {
            addSubConstantInfo.Set(instr->GetSrc1()->AsRegOpnd()->m_sym, src1Val, min == max, -1);
        }

        opcode = Js::OpCode::Sub_I4;
        if (!this->IsLoopPrePass())
        {
            instr->SetSrc2(IR::IntConstOpnd::New(1, TyInt32, instr->m_func));
        }
        checkTypeSpecWorth = true;
        break;

    case Js::OpCode::BrFalse_A:
    case Js::OpCode::BrTrue_A:
    {
        if(DoConstFold() && !IsLoopPrePass() && TryOptConstFoldBrFalse(instr, src1Val, min, max))
        {
            return true;
        }

        bool specialize = true;
        if (!src1Val->GetValueInfo()->HasIntConstantValue() && instr->GetSrc1()->IsRegOpnd())
        {
            StackSym *sym = instr->GetSrc1()->AsRegOpnd()->m_sym;
            if (CurrentBlockData()->IsInt32TypeSpecialized(sym) == false)
            {
                // Type specializing a BrTrue_A/BrFalse_A isn't worth it, unless the src
                // is already type specialized
                specialize = false;
            }
        }
        if(instr->m_opcode == Js::OpCode::BrTrue_A)
        {
            UpdateIntBoundsForNotEqualBranch(src1Val, nullptr, 0);
            opcode = Js::OpCode::BrTrue_I4;
        }
        else
        {
            UpdateIntBoundsForEqualBranch(src1Val, nullptr, 0);
            opcode = Js::OpCode::BrFalse_I4;
        }
        if(!specialize)
        {
            return false;
        }

        newMin = 2; newMax = 1;  // We'll assert if we make a range where min > max
        break;
    }

    case Js::OpCode::MultiBr:
        newMin = min;
        newMax = max;
        opcode = instr->m_opcode;
        break;

    case Js::OpCode::StElemI_A:
    case Js::OpCode::StElemI_A_Strict:
    case Js::OpCode::StElemC:
        if(instr->GetDst()->AsIndirOpnd()->GetBaseOpnd()->GetValueType().IsLikelyAnyArrayWithNativeFloatValues())
        {
            src1Val = src1OriginalVal;
        }
        return TypeSpecializeStElem(pInstr, src1Val, pDstVal);

    case Js::OpCode::NewScArray:
    case Js::OpCode::NewScArrayWithMissingValues:
    case Js::OpCode::InitFld:
    case Js::OpCode::InitRootFld:
    case Js::OpCode::StSlot:
    case Js::OpCode::StSlotChkUndecl:
#if !FLOATVAR
    case Js::OpCode::StSlotBoxTemp:
#endif
    case Js::OpCode::StFld:
    case Js::OpCode::StRootFld:
    case Js::OpCode::StFldStrict:
    case Js::OpCode::StRootFldStrict:
    case Js::OpCode::ArgOut_A:
    case Js::OpCode::ArgOut_A_Inline:
    case Js::OpCode::ArgOut_A_FixupForStackArgs:
    case Js::OpCode::ArgOut_A_Dynamic:
    case Js::OpCode::ArgOut_A_FromStackArgs:
    case Js::OpCode::ArgOut_A_SpreadArg:
    // For this one we need to implement type specialization
    //case Js::OpCode::ArgOut_A_InlineBuiltIn:
    case Js::OpCode::Ret:
    case Js::OpCode::LdElemUndef:
    case Js::OpCode::LdElemUndefScoped:
        return false;

    default:
        if (OpCodeAttr::IsInlineBuiltIn(instr->m_opcode))
        {
            newMin = min;
            newMax = max;
            opcode = instr->m_opcode;
            break; // Note: we must keep checkTypeSpecWorth = false to make sure we never return false from this function.
        }
        return false;
    }

    // If this instruction is in a range of instructions where int overflow does not matter, we will still specialize it (won't
    // leave it unspecialized based on heuristics), since it is most likely worth specializing, and the dst value needs to be
    // guaranteed to be an int
    if(checkTypeSpecWorth &&
        !ignoredIntOverflow &&
        !ignoredNegativeZero &&
        instr->ShouldCheckForIntOverflow() &&
        !IsWorthSpecializingToInt32(instr, src1Val))
    {
        // Even though type specialization is being skipped since it may not be worth it, the proper value should still be
        // maintained so that the result may be type specialized later. An int value is not created for the dst in any of
        // the following cases.
        // - A bailout check is necessary to specialize this instruction. The bailout check is what guarantees the result to be
        //   an int, but since we're not going to specialize this instruction, there won't be a bailout check.
        // - Aggressive int type specialization is disabled and we're in a loop prepass. We're conservative on dst values in
        //   that case, especially if the dst sym is live on the back-edge.
        if(bailOutKind == IR::BailOutInvalid &&
            instr->GetDst() &&
            (DoAggressiveIntTypeSpec() || !this->IsLoopPrePass()))
        {
            *pDstVal = CreateDstUntransferredIntValue(newMin, newMax, instr, src1Val, nullptr);
        }

        if(instr->GetSrc2())
        {
            instr->FreeSrc2();
        }
        return false;
    }

    this->ignoredIntOverflowForCurrentInstr = ignoredIntOverflow;
    this->ignoredNegativeZeroForCurrentInstr = ignoredNegativeZero;

    {
        // Try CSE again before modifying the IR, in case some attributes are required for successful CSE
        Value *src1IndirIndexVal = nullptr;
        Value *src2Val = nullptr;
        if(CSEOptimize(currentBlock, &instr, &src1Val, &src2Val, &src1IndirIndexVal, true /* intMathExprOnly */))
        {
            *redoTypeSpecRef = true;
            return false;
        }
    }

    const Js::OpCode originalOpCode = instr->m_opcode;
    if (!this->IsLoopPrePass())
    {
        // No re-write on prepass
        instr->m_opcode = opcode;
    }

    Value *src1ValueToSpecialize = src1Val;
    if(lossy)
    {
        // Lossy conversions to int32 must be done based on the original source values. For instance, if one of the values is a
        // float constant with a value that fits in a uint32 but not an int32, and the instruction can ignore int overflow, the
        // source value for the purposes of int specialization would have been changed to an int constant value by ignoring
        // overflow. If we were to specialize the sym using the int constant value, it would be treated as a lossless
        // conversion, but since there may be subsequent uses of the same float constant value that may not ignore overflow,
        // this must be treated as a lossy conversion by specializing the sym using the original float constant value.
        src1ValueToSpecialize = src1OriginalVal;
    }

    // Make sure the srcs are specialized
    IR::Opnd *src1 = instr->GetSrc1();
    this->ToInt32(instr, src1, this->currentBlock, src1ValueToSpecialize, nullptr, lossy);

    if(bailOutKind != IR::BailOutInvalid && !this->IsLoopPrePass())
    {
        GenerateBailAtOperation(&instr, bailOutKind);
    }

    if (!skipDst)
    {
        IR::Opnd *dst = instr->GetDst();
        if (dst)
        {
            AssertMsg(!(isTransfer && !this->IsLoopPrePass()) || min == newMin && max == newMax, "If this is just a copy, old/new min/max should be the same");
            TypeSpecializeIntDst(
                instr,
                originalOpCode,
                isTransfer ? src1Val : nullptr,
                src1Val,
                nullptr,
                bailOutKind,
                newMin,
                newMax,
                pDstVal,
                addSubConstantInfo.HasInfo() ? &addSubConstantInfo : nullptr);
        }
    }

    if(bailOutKind == IR::BailOutInvalid)
    {
        GOPT_TRACE(_u("Type specialized to INT\n"));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::AggressiveIntTypeSpecPhase))
        {
            Output::Print(_u("Type specialized to INT: "));
            Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
        }
#endif
    }
    else
    {
        GOPT_TRACE(_u("Type specialized to INT with bailout on:\n"));
        if(bailOutKind & IR::BailOutOnOverflow)
        {
            GOPT_TRACE(_u("    Overflow\n"));
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::AggressiveIntTypeSpecPhase))
            {
                Output::Print(_u("Type specialized to INT with bailout (%S): "), "Overflow");
                Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
            }
#endif
        }
        if(bailOutKind & IR::BailOutOnNegativeZero)
        {
            GOPT_TRACE(_u("    Zero\n"));
#if ENABLE_DEBUG_CONFIG_OPTIONS
            if (Js::Configuration::Global.flags.TestTrace.IsEnabled(Js::AggressiveIntTypeSpecPhase))
            {
                Output::Print(_u("Type specialized to INT with bailout (%S): "), "Zero");
                Output::Print(_u("%s \n"), Js::OpCodeUtil::GetOpCodeName(instr->m_opcode));
            }
#endif
        }
    }

    return true;
}